

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.hpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::makePageResident
          (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *this,size_t pageNdx)

{
  pointer pBVar1;
  pointer pBVar2;
  Resource *pRVar3;
  int iVar4;
  ulong uVar5;
  reference rVar6;
  
  pBVar1 = (this->m_elements).
           super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar2 = (this->m_elements).
           super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = (*((this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
             m_data.ptr)->_vptr_Resource[4])();
  if (pageNdx * 0x2000 != (long)iVar4) {
    pRVar3 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
             m_data.ptr;
    (*pRVar3->_vptr_Resource[5])(pRVar3,pageNdx * 0x2000 & 0xffffffff);
  }
  uVar5 = (long)pBVar1 - (long)(pBVar2 + pageNdx * 0x400);
  if (0x1fff < uVar5) {
    uVar5 = 0x2000;
  }
  pRVar3 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
           m_data.ptr;
  (*pRVar3->_vptr_Resource[2])
            (pRVar3,(this->m_elements).
                    super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                    ._M_impl.super__Vector_impl_data._M_start + pageNdx * 0x400,uVar5 & 0xffffffff);
  rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_isPageResident,pageNdx);
  *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
  return;
}

Assistant:

void LazyResource<Element>::makePageResident (size_t pageNdx)
{
	const size_t	pageSize		= (size_t)(1<<ELEMENTS_PER_PAGE_LOG2)*sizeof(Element);
	const size_t	pageOffset		= pageNdx*pageSize;
	const size_t	numBytesToRead	= de::min(m_elements.size()*sizeof(Element) - pageOffset, pageSize);

	DE_ASSERT(!isPageResident(pageNdx));

	if ((size_t)m_resource->getPosition() != pageOffset)
		m_resource->setPosition((int)pageOffset);

	m_resource->read((deUint8*)&m_elements[pageNdx << ELEMENTS_PER_PAGE_LOG2], (int)numBytesToRead);
	m_isPageResident[pageNdx] = true;
}